

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

void Gia_ManGnuplotShow(char *pPlotFileName)

{
  int iVar1;
  FILE *__stream;
  Abc_Frame_t *pAbc_00;
  char *pcVar2;
  char local_428 [8];
  char Command [1000];
  char *local_38;
  char *pProgNameGnuplot;
  char *pProgNameGnuplotUnix;
  char *pProgNameGnuplotWin;
  void *pAbc;
  FILE *pFile;
  char *pPlotFileName_local;
  
  pProgNameGnuplotUnix = "wgnuplot.exe";
  pProgNameGnuplot = "gnuplot";
  __stream = fopen(pPlotFileName,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the plot file \"%s\".\n\n",pPlotFileName);
  }
  else {
    fclose(__stream);
    pAbc_00 = Abc_FrameGetGlobalFrame();
    pcVar2 = Cmd_FlagReadByName(pAbc_00,"gnuplotwin");
    if (pcVar2 != (char *)0x0) {
      pProgNameGnuplotUnix = Cmd_FlagReadByName(pAbc_00,"gnuplotwin");
    }
    pcVar2 = Cmd_FlagReadByName(pAbc_00,"gnuplotunix");
    if (pcVar2 != (char *)0x0) {
      pProgNameGnuplot = Cmd_FlagReadByName(pAbc_00,"gnuplotunix");
    }
    pAbc = fopen(pProgNameGnuplotUnix,"r");
    if ((FILE *)pAbc == (FILE *)0x0) {
      pAbc = fopen(pProgNameGnuplot,"r");
      if ((FILE *)pAbc == (FILE *)0x0) {
        fprintf(_stdout,"Cannot find \"%s\" or \"%s\" in the current directory.\n",
                pProgNameGnuplotUnix,pProgNameGnuplot);
        return;
      }
      local_38 = pProgNameGnuplot;
    }
    else {
      local_38 = pProgNameGnuplotUnix;
    }
    fclose((FILE *)pAbc);
    sprintf(local_428,"%s %s ",local_38,pPlotFileName);
    iVar1 = system(local_428);
    if (iVar1 == -1) {
      fprintf(_stdout,"Cannot execute \"%s\".\n",local_428);
    }
  }
  return;
}

Assistant:

void Gia_ManGnuplotShow( char * pPlotFileName )
{
    FILE * pFile;
    void * pAbc;
    char * pProgNameGnuplotWin  = "wgnuplot.exe";
    char * pProgNameGnuplotUnix = "gnuplot";
    char * pProgNameGnuplot = NULL;

    // read in the Capo plotting output
    if ( (pFile = fopen( pPlotFileName, "r" )) == NULL )
    {
        fprintf( stdout, "Cannot open the plot file \"%s\".\n\n", pPlotFileName );
        return;
    }
    fclose( pFile );

    pAbc = Abc_FrameGetGlobalFrame();

    // get the names from the plotting software
    if ( Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotwin") )
        pProgNameGnuplotWin = Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotwin");
    if ( Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotunix") )
        pProgNameGnuplotUnix = Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotunix");

    // check if Gnuplot is available
    if ( (pFile = fopen( pProgNameGnuplotWin, "r" )) )
        pProgNameGnuplot = pProgNameGnuplotWin;
    else if ( (pFile = fopen( pProgNameGnuplotUnix, "r" )) )
        pProgNameGnuplot = pProgNameGnuplotUnix;
    else if ( pFile == NULL )
    {
        fprintf( stdout, "Cannot find \"%s\" or \"%s\" in the current directory.\n", pProgNameGnuplotWin, pProgNameGnuplotUnix );
        return;
    }
    fclose( pFile );

    // spawn the viewer
#ifdef WIN32
    if ( _spawnl( _P_NOWAIT, pProgNameGnuplot, pProgNameGnuplot, pPlotFileName, NULL ) == -1 )
    {
        fprintf( stdout, "Cannot find \"%s\".\n", pProgNameGnuplot );
        return;
    }
#else
    {
        char Command[1000];
        sprintf( Command, "%s %s ", pProgNameGnuplot, pPlotFileName );
        if ( system( Command ) == -1 )
        {
            fprintf( stdout, "Cannot execute \"%s\".\n", Command );
            return;
        }
    }
#endif
}